

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  FILE *__stream;
  char *pcVar4;
  SetKey<int,_Negation<int>_> *set;
  AssertionResult gtest_ar_3;
  size_t num_bytes;
  size_type __dnew_1;
  char contents [24];
  string kExpectedDense;
  string kExpectedSparse;
  TypeParam ht_out;
  AssertHelper local_178;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_170;
  undefined8 *local_168;
  AssertHelper local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [16];
  AssertHelper local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined **local_d0;
  undefined1 local_c8 [72];
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> local_80;
  
  local_f0._M_dataplus._M_p = (pointer)0x0;
  local_f0._M_string_length = local_f0._M_string_length & 0xffffffff00000000;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
  local_110._M_dataplus._M_p = local_110._M_dataplus._M_p & 0xffffffff00000000;
  local_110._M_string_length = 0;
  local_d0 = &PTR__BaseHashtableInterface_00c231b8;
  set = (SetKey<int,_Negation<int>_> *)&local_170;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(Hasher *)&local_f0,(Hasher *)local_158,
                     (Negation<int> *)local_138,set,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_110);
  local_d0 = &PTR__BaseHashtableInterface_00c23138;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_f0._M_dataplus._M_p = &DAT_00000018;
  local_110._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
  local_110.field_2._M_allocated_capacity = (size_type)local_f0._M_dataplus._M_p;
  *(undefined8 *)local_110._M_dataplus._M_p = 0x42865713;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 8) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 9) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 10) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0xb) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0xc) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0xd) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0xe) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0xf) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x10) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x11) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x12) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x13) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x14) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x15) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x16) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p + 0x17) = '\0';
  local_110._M_string_length = (size_type)local_f0._M_dataplus._M_p;
  local_110._M_dataplus._M_p[(long)local_f0._M_dataplus._M_p] = '\0';
  local_158._0_8_ = (char *)0x14;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_f0,(ulong)local_158);
  local_f0.field_2._M_allocated_capacity = local_158._0_8_;
  builtin_strncpy(local_f0._M_dataplus._M_p,"$hu1",5);
  local_f0._M_dataplus._M_p[5] = '\0';
  local_f0._M_dataplus._M_p[6] = '\0';
  local_f0._M_dataplus._M_p[7] = ' ';
  local_f0._M_dataplus._M_p[8] = '\0';
  local_f0._M_dataplus._M_p[9] = '\0';
  local_f0._M_dataplus._M_p[10] = '\0';
  local_f0._M_dataplus._M_p[0xb] = '\0';
  local_f0._M_dataplus._M_p[0xc] = '\0';
  local_f0._M_dataplus._M_p[0xd] = '\0';
  local_f0._M_dataplus._M_p[0xe] = '\0';
  local_f0._M_dataplus._M_p[0xf] = '\0';
  local_f0._M_dataplus._M_p[0x10] = '\0';
  local_f0._M_dataplus._M_p[0x11] = '\0';
  local_f0._M_dataplus._M_p[0x12] = '\0';
  local_f0._M_dataplus._M_p[0x13] = '\0';
  local_f0._M_string_length = local_158._0_8_;
  local_f0._M_dataplus._M_p[local_158._0_8_] = '\0';
  __stream = tmpfile();
  local_138[0] = (Negation<int>)(__stream != (FILE *)0x0);
  local_138._8_8_ = (undefined8 *)0x0;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_138,(AssertionResult *)"fp != __null","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x542,(char *)local_158._0_8_);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_);
    }
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  uVar2 = local_138._8_8_;
  if ((undefined8 *)local_138._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_138._8_8_ != (undefined8 *)(local_138._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_138._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  bVar3 = google::
          sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
          write_metadata<_IO_FILE>
                    ((sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(local_c8 + 0x48),(_IO_FILE *)__stream);
  local_138[0] = (Negation<int>)bVar3;
  local_138._8_8_ = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_138,
               (AssertionResult *)"ht_out.write_metadata(fp)","false","true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x544,(char *)local_158._0_8_);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_);
    }
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  uVar2 = local_138._8_8_;
  if ((undefined8 *)local_138._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_138._8_8_ != (undefined8 *)(local_138._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_138._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  bVar3 = google::
          sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
          write_nopointer_data
                    ((sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(local_c8 + 0x48),(FILE *)__stream);
  local_138[0] = (Negation<int>)bVar3;
  local_138._8_8_ = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_138,
               (AssertionResult *)"ht_out.write_nopointer_data(fp)","false","true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x545,(char *)local_158._0_8_);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_);
    }
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  uVar2 = local_138._8_8_;
  if ((undefined8 *)local_138._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_138._8_8_ != (undefined8 *)(local_138._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_138._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_160.data_ = (AssertHelperData *)ftell(__stream);
  rewind(__stream);
  local_138._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x18;
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_158,"num_bytes","static_cast<size_t>(24)",(unsigned_long *)&local_160
             ,(unsigned_long *)local_138);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if ((char *)local_158._8_8_ == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_158._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x549,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._0_8_ + 8))();
    }
  }
  uVar2 = local_158._8_8_;
  if ((char *)local_158._8_8_ != (char *)0x0) {
    if (*(char **)local_158._8_8_ != (char *)(local_158._8_8_ + 0x10)) {
      operator_delete(*(char **)local_158._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_170._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       fread(local_138,1,(size_t)local_160.data_,__stream);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_158,"num_bytes","fread(contents, 1, num_bytes, fp)",
             (unsigned_long *)&local_160,(unsigned_long *)&local_170);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if ((char *)local_158._8_8_ == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_158._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x54b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  uVar2 = local_158._8_8_;
  if ((char *)local_158._8_8_ != (char *)0x0) {
    if (*(char **)local_158._8_8_ != (char *)(local_158._8_8_ + 0x10)) {
      operator_delete(*(char **)local_158._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_170._M_head_impl._0_4_ = 0xffffffff;
  local_178.data_._0_4_ = fgetc(__stream);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_158,"(-1)","fgetc(fp)",(int *)&local_170,(int *)&local_178);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if ((char *)local_158._8_8_ == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_158._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x54c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  uVar2 = local_158._8_8_;
  if ((char *)local_158._8_8_ != (char *)0x0) {
    if (*(char **)local_158._8_8_ != (char *)(local_158._8_8_ + 0x10)) {
      operator_delete(*(char **)local_158._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  fclose(__stream);
  if (local_138[0] == (Negation<int>)*local_110._M_dataplus._M_p) {
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,local_138,
               (undefined1 *)((long)&(local_160.data_)->type + (long)local_138));
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_170,"kExpectedDense","string(contents, num_bytes)",&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_);
    }
    if (local_170._M_head_impl._0_1_ == (SetKey<int,_Negation<int>_>)0x0) {
      testing::Message::Message((Message *)local_158);
      if (local_168 == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)*local_168;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x550,pcVar4);
      testing::internal::AssertHelper::operator=(&local_178,(Message *)local_158);
LAB_009c52dc:
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      if ((long *)local_158._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_158._0_8_ + 8))();
      }
    }
  }
  else {
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,local_138,
               (undefined1 *)((long)&(local_160.data_)->type + (long)local_138));
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_170,"kExpectedSparse","string(contents, num_bytes)",&local_f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_);
    }
    if (local_170._M_head_impl._0_1_ == (SetKey<int,_Negation<int>_>)0x0) {
      testing::Message::Message((Message *)local_158);
      if (local_168 == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)*local_168;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x552,pcVar4);
      testing::internal::AssertHelper::operator=(&local_178,(Message *)local_158);
      goto LAB_009c52dc;
    }
  }
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(local_168);
  }
  local_158._8_8_ = (char *)0x0;
  local_158[0x10] = '\0';
  local_160.data_ = (AssertHelperData *)local_158;
  local_158._0_8_ = local_158 + 0x10;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  bVar3 = google::
          sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>::
          serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                    ((sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)(local_c8 + 0x48),&local_160);
  local_170._M_head_impl._0_1_ = (SetKey<int,_Negation<int>_>)bVar3;
  local_168 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_170,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55b,(char *)local_138._0_8_);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
        != local_128) {
      operator_delete((void *)local_138._0_8_);
    }
    if ((long *)CONCAT44(local_178.data_._4_4_,(int)local_178.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,(int)local_178.data_) + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  if (*(char *)local_158._0_8_ == *local_110._M_dataplus._M_p) {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)local_138,"kExpectedDense","stringbuf",&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    if (local_138[0] != (Negation<int>)0x0) goto LAB_009c552c;
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_138._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_138._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
  }
  else {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)local_138,"kExpectedSparse","stringbuf",&local_f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    if (local_138[0] != (Negation<int>)0x0) goto LAB_009c552c;
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_138._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_138._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_178);
  if (local_170._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_170._M_head_impl + 8))();
  }
LAB_009c552c:
  uVar2 = local_138._8_8_;
  if ((undefined8 *)local_138._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_138._8_8_ != (undefined8 *)(local_138._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_138._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_d0 = &PTR__BaseHashtableInterface_00c231b8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_c8 + 0x48));
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}